

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

void re2c::prtChOrHexForSpan(ostream *o,uint32_t c)

{
  bool bVar1;
  type_t tVar2;
  opt_t *poVar3;
  uint32_t c_local;
  ostream *o_local;
  
  poVar3 = Opt::operator->((Opt *)&opts);
  tVar2 = Enc::type(&poVar3->encoding);
  if (((tVar2 == EBCDIC) || (bVar1 = is_print(c), !bVar1)) || (c == 0x5d)) {
    prtHex(o,c);
  }
  else {
    prtCh(o,c);
  }
  return;
}

Assistant:

void prtChOrHexForSpan(std::ostream& o, uint32_t c)
{
	if (opts->encoding.type () != Enc::EBCDIC
		&& is_print (c)
		&& (c != ']'))
	{
		prtCh(o, c);
	}
	else
	{
		prtHex(o, c);
	}
}